

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

void __thiscall serialization::xml_iarchive::load_sequence_item_end(xml_iarchive *this)

{
  _Elt_pointer ppxVar1;
  xml_node<char> *pxVar2;
  
  ppxVar1 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar1 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar1 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pxVar2 = rapidxml::xml_node<char>::next_sibling(ppxVar1[-1],"item",0,true);
  ppxVar1 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar1 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar1 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppxVar1[-1] = pxVar2;
  return;
}

Assistant:

void load_sequence_item_end() const
    {
        serialization_trace trace(__func__, "json");
        stack_.top() = stack_.top()->next_sibling("item");
    }